

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall soplex::SSVectorBase<double>::setup(SSVectorBase<double> *this)

{
  int *piVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  Tolerances *this_00;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  
  if (this->setupStatus == false) {
    pdVar3 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pdVar4 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->super_IdxSet).num = 0;
    uVar5 = (uint)((ulong)((long)pdVar3 - (long)pdVar4) >> 3);
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        dVar2 = (this->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar6];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (this_00 == (Tolerances *)0x0) {
            dVar7 = 0.0;
          }
          else {
            dVar7 = Tolerances::epsilon(this_00);
          }
          if (ABS(dVar2) <= dVar7) {
            (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6] = 0.0;
          }
          else {
            (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)uVar6;
            piVar1 = &(this->super_IdxSet).num;
            *piVar1 = *piVar1 + 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar6);
    }
    this->setupStatus = true;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }